

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnativesocketengine_p.cpp
# Opt level: O2

void QNativeSocketEngine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  SocketState SVar1;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  (**(code **)(*(long *)_o + 0x80))
            (_o,*(long *)(_o + 8) + 0xb8,*(undefined2 *)(*(long *)(_o + 8) + 0xc0));
  SVar1 = QAbstractSocketEngine::state((QAbstractSocketEngine *)_o);
  if (SVar1 == ConnectingState) {
    return;
  }
  QAbstractSocketEngine::connectionNotification((QAbstractSocketEngine *)_o);
  return;
}

Assistant:

void QNativeSocketEngine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNativeSocketEngine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->connectionNotification(); break;
        default: ;
        }
    }
    (void)_a;
}